

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

QSize __thiscall QLineEdit::sizeHint(QLineEdit *this)

{
  int iVar1;
  int iVar2;
  QFont *pQVar3;
  QStyle *pQVar4;
  int *piVar5;
  QSize QVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int w;
  int h;
  int iconSize;
  QLineEditPrivate *d;
  QMargins tm;
  QFontMetrics fm;
  QStyleOptionFrame opt;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 local_90 [10];
  QChar local_86;
  int local_84 [3];
  undefined1 local_78 [24];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QLineEdit *)0x5c43d0);
  QWidget::ensurePolished(in_RDI);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QWidget::font(in_RDI);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_60,pQVar3);
  pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  iVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x3e,0,in_RDI);
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_16_ =
       (undefined1  [16])
       QLineEditPrivate::effectiveTextMargins
                 ((QLineEditPrivate *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
  ;
  local_84[2] = QFontMetrics::height();
  local_84[1] = 0xe;
  local_84[0] = iVar1 + -2;
  piVar5 = qMax<int>(local_84 + 1,local_84);
  piVar5 = qMax<int>(local_84 + 2,piVar5);
  iVar1 = *piVar5 + 2;
  iVar2 = QMargins::top((QMargins *)0x5c44d9);
  iVar2 = iVar1 + iVar2;
  QMargins::bottom((QMargins *)0x5c44ef);
  QChar::QChar<char16_t,_true>(&local_86,L'x');
  QFontMetrics::horizontalAdvance((QChar *)&local_60);
  QMargins::left((QMargins *)0x5c455d);
  QMargins::right((QMargins *)0x5c4573);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x5c45d7);
  (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,&local_58);
  pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QSize::QSize((QSize *)CONCAT44(iVar2,iVar1),in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  QVar6 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))(pQVar4,0xe,&local_58,local_90,in_RDI);
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x5c4647);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QSize QLineEdit::sizeHint() const
{
    Q_D(const QLineEdit);
    ensurePolished();
    QFontMetrics fm(font());
    const int iconSize = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, this);
    const QMargins tm = d->effectiveTextMargins();
    int h = qMax(fm.height(), qMax(14, iconSize - 2)) + 2 * QLineEditPrivate::verticalMargin
            + tm.top() + tm.bottom()
            + d->topmargin + d->bottommargin;
    int w = fm.horizontalAdvance(u'x') * 17 + 2 * QLineEditPrivate::horizontalMargin
            + tm.left() + tm.right()
            + d->leftmargin + d->rightmargin; // "some"
    QStyleOptionFrame opt;
    initStyleOption(&opt);
    return style()->sizeFromContents(QStyle::CT_LineEdit, &opt, QSize(w, h), this);
}